

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

uchar * jpgd::decompress_jpeg_image_from_stream
                  (jpeg_decoder_stream *pStream,int *width,int *height,int *actual_comps,
                  int req_comps,uint32_t flags)

{
  uchar uVar1;
  int iVar2;
  uchar *__ptr;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uchar *puVar8;
  size_t __n;
  uint8 *pScan_line;
  uint scan_line_len;
  jpeg_decoder decoder;
  uchar *local_3520;
  ulong local_3518;
  uint local_350c;
  jpeg_decoder local_3508;
  
  if ((actual_comps == (int *)0x0) ||
     (*actual_comps = 0,
     (req_comps == 0 || height == (int *)0x0) ||
     (width == (int *)0x0 || pStream == (jpeg_decoder_stream *)0x0))) {
    return (uchar *)0x0;
  }
  if (4 < (uint)req_comps) {
    return (uchar *)0x0;
  }
  if ((0x1aU >> (req_comps & 0x1fU) & 1) == 0) {
    return (uchar *)0x0;
  }
  jpeg_decoder::jpeg_decoder(&local_3508,pStream,flags);
  if (local_3508.m_error_code == JPGD_SUCCESS) {
    uVar4 = (ulong)(uint)local_3508.m_image_x_size;
    *width = local_3508.m_image_x_size;
    *height = local_3508.m_image_y_size;
    *actual_comps = local_3508.m_comps_in_frame;
    iVar2 = jpeg_decoder::begin_decoding(&local_3508);
    if (iVar2 == 0) {
      __ptr = (uchar *)malloc((long)(local_3508.m_image_x_size * req_comps *
                                    local_3508.m_image_y_size));
      if (__ptr != (uchar *)0x0) {
        local_3518 = (ulong)(uint)local_3508.m_image_y_size;
        if (0 < local_3508.m_image_y_size) {
          __n = (size_t)(local_3508.m_image_x_size * req_comps);
          uVar7 = 0;
          puVar8 = __ptr;
          do {
            iVar2 = jpeg_decoder::decode(&local_3508,&local_3520,&local_350c);
            if (iVar2 != 0) {
              free(__ptr);
              goto LAB_00153835;
            }
            if (req_comps == 4) {
              if (local_3508.m_comps_in_frame == 1) {
LAB_0015395f:
                if (req_comps == 3) {
                  if (0 < local_3508.m_image_x_size) {
                    lVar6 = 0;
                    puVar3 = local_3520;
                    do {
                      uVar1 = *puVar3;
                      puVar8[lVar6] = uVar1;
                      puVar8[lVar6 + 1] = uVar1;
                      puVar8[lVar6 + 2] = uVar1;
                      puVar3 = puVar3 + 1;
                      lVar6 = lVar6 + 3;
                    } while (uVar4 * 3 != lVar6);
                  }
                }
                else if (0 < local_3508.m_image_x_size) {
                  uVar5 = 0;
                  do {
                    uVar1 = local_3520[uVar5];
                    puVar8[uVar5 * 4] = uVar1;
                    puVar8[uVar5 * 4 + 1] = uVar1;
                    puVar8[uVar5 * 4 + 2] = uVar1;
                    puVar8[uVar5 * 4 + 3] = 0xff;
                    uVar5 = uVar5 + 1;
                  } while (uVar4 != uVar5);
                }
              }
              else if (local_3508.m_comps_in_frame == 3) goto LAB_00153935;
            }
            else if (req_comps == 1) {
              if (local_3508.m_comps_in_frame == 1) {
LAB_00153935:
                memcpy(__ptr + uVar7 * __n,local_3520,__n);
              }
              else if ((local_3508.m_comps_in_frame == 3) && (0 < local_3508.m_image_x_size)) {
                uVar5 = 0;
                do {
                  puVar8[uVar5] =
                       (uchar)((uint)local_3520[uVar5 * 4 + 2] * 0x1d2f +
                               (uint)local_3520[uVar5 * 4 + 1] * 0x9646 +
                               (uint)local_3520[uVar5 * 4] * 0x4c8b + 0x8000 >> 0x10);
                  uVar5 = uVar5 + 1;
                } while (uVar4 != uVar5);
              }
            }
            else if (local_3508.m_comps_in_frame == 3) {
              if (0 < local_3508.m_image_x_size) {
                puVar3 = local_3520 + 2;
                lVar6 = 0;
                do {
                  puVar8[lVar6] = puVar3[-2];
                  puVar8[lVar6 + 1] = puVar3[-1];
                  puVar8[lVar6 + 2] = *puVar3;
                  puVar3 = puVar3 + 4;
                  lVar6 = lVar6 + 3;
                } while (uVar4 * 3 != lVar6);
              }
            }
            else if (local_3508.m_comps_in_frame == 1) goto LAB_0015395f;
            uVar7 = uVar7 + 1;
            puVar8 = puVar8 + __n;
          } while (uVar7 != local_3518);
        }
        goto LAB_00153837;
      }
    }
  }
LAB_00153835:
  __ptr = (uchar *)0x0;
LAB_00153837:
  jpeg_decoder::~jpeg_decoder(&local_3508);
  return __ptr;
}

Assistant:

unsigned char* decompress_jpeg_image_from_stream(jpeg_decoder_stream* pStream, int* width, int* height, int* actual_comps, int req_comps, uint32_t flags)
	{
		if (!actual_comps)
			return nullptr;
		*actual_comps = 0;

		if ((!pStream) || (!width) || (!height) || (!req_comps))
			return nullptr;

		if ((req_comps != 1) && (req_comps != 3) && (req_comps != 4))
			return nullptr;

		jpeg_decoder decoder(pStream, flags);
		if (decoder.get_error_code() != JPGD_SUCCESS)
			return nullptr;

		const int image_width = decoder.get_width(), image_height = decoder.get_height();
		*width = image_width;
		*height = image_height;
		*actual_comps = decoder.get_num_components();

		if (decoder.begin_decoding() != JPGD_SUCCESS)
			return nullptr;

		const int dst_bpl = image_width * req_comps;

		uint8* pImage_data = (uint8*)jpgd_malloc(dst_bpl * image_height);
		if (!pImage_data)
			return nullptr;

		for (int y = 0; y < image_height; y++)
		{
			const uint8* pScan_line;
			uint scan_line_len;
			if (decoder.decode((const void**)&pScan_line, &scan_line_len) != JPGD_SUCCESS)
			{
				jpgd_free(pImage_data);
				return nullptr;
			}

			uint8* pDst = pImage_data + y * dst_bpl;

			if (((req_comps == 1) && (decoder.get_num_components() == 1)) || ((req_comps == 4) && (decoder.get_num_components() == 3)))
				memcpy(pDst, pScan_line, dst_bpl);
			else if (decoder.get_num_components() == 1)
			{
				if (req_comps == 3)
				{
					for (int x = 0; x < image_width; x++)
					{
						uint8 luma = pScan_line[x];
						pDst[0] = luma;
						pDst[1] = luma;
						pDst[2] = luma;
						pDst += 3;
					}
				}
				else
				{
					for (int x = 0; x < image_width; x++)
					{
						uint8 luma = pScan_line[x];
						pDst[0] = luma;
						pDst[1] = luma;
						pDst[2] = luma;
						pDst[3] = 255;
						pDst += 4;
					}
				}
			}
			else if (decoder.get_num_components() == 3)
			{
				if (req_comps == 1)
				{
					const int YR = 19595, YG = 38470, YB = 7471;
					for (int x = 0; x < image_width; x++)
					{
						int r = pScan_line[x * 4 + 0];
						int g = pScan_line[x * 4 + 1];
						int b = pScan_line[x * 4 + 2];
						*pDst++ = static_cast<uint8>((r * YR + g * YG + b * YB + 32768) >> 16);
					}
				}
				else
				{
					for (int x = 0; x < image_width; x++)
					{
						pDst[0] = pScan_line[x * 4 + 0];
						pDst[1] = pScan_line[x * 4 + 1];
						pDst[2] = pScan_line[x * 4 + 2];
						pDst += 3;
					}
				}
			}
		}

		return pImage_data;
	}